

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcPile::~IfcPile(IfcPile *this)

{
  *(undefined8 *)&this[-1].field_0x70 = 0x872870;
  *(undefined8 *)&this->field_0x58 = 0x872988;
  *(undefined8 *)&this[-1].field_0xf8 = 0x872898;
  *(undefined8 *)&this[-1].field_0x108 = 0x8728c0;
  *(undefined8 *)&this[-1].field_0x140 = 0x8728e8;
  *(undefined8 *)&this[-1].field_0x170 = 0x872910;
  *(undefined8 *)&this[-1].field_0x1a8 = 0x872938;
  *(undefined8 *)this = 0x872960;
  if (*(undefined1 **)&this->field_0x30 != &this->field_0x40) {
    operator_delete(*(undefined1 **)&this->field_0x30,*(long *)&this->field_0x40 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x70,&PTR_construction_vtable_24__008729a8);
  operator_delete(&this[-1].field_0x70,0x1b8);
  return;
}

Assistant:

IfcPile() : Object("IfcPile") {}